

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O2

__pid_t __thiscall QWaitConditionPrivate::wait(QWaitConditionPrivate *this,void *__stat_loc)

{
  int iVar1;
  int iVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar3;
  undefined8 in_RDX;
  char *what;
  QDeadlineTimer deadline;
  
  do {
    if (__stat_loc == (void *)0x7fffffffffffffff) {
      iVar1 = pthread_cond_wait((pthread_cond_t *)&this->cond,(pthread_mutex_t *)this);
    }
    else {
      deadline._8_8_ = in_RDX;
      deadline.t1 = (qint64)__stat_loc;
      iVar1 = wait_relative(this,deadline);
    }
  } while (iVar1 == 0 && this->wakeups == 0);
  this->waiters = this->waiters + -1;
  if (iVar1 == 0) {
    this->wakeups = this->wakeups + -1;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this);
    what = "mutex unlock";
  }
  else {
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this);
    qt_report_pthread_error(iVar2,"QWaitCondition::wait()","mutex unlock");
    uVar3 = extraout_RAX;
    if (iVar1 == 0x6e) goto LAB_00386bd3;
    what = "cv wait";
    iVar2 = iVar1;
  }
  qt_report_pthread_error(iVar2,"QWaitCondition::wait()",what);
  uVar3 = extraout_RAX_00;
LAB_00386bd3:
  return (__pid_t)CONCAT71((int7)((ulong)uVar3 >> 8),iVar1 == 0);
}

Assistant:

bool wait(QDeadlineTimer deadline)
    {
        int code;
        forever {
            if (!deadline.isForever()) {
                code = wait_relative(deadline);
            } else {
                code = pthread_cond_wait(&cond, &mutex);
            }
            if (code == 0 && wakeups == 0) {
                // spurious wakeup
                continue;
            }
            break;
        }

        Q_ASSERT_X(waiters > 0, "QWaitCondition::wait", "internal error (waiters)");
        --waiters;
        if (code == 0) {
            Q_ASSERT_X(wakeups > 0, "QWaitCondition::wait", "internal error (wakeups)");
            --wakeups;
        }
        qt_report_pthread_error(pthread_mutex_unlock(&mutex), "QWaitCondition::wait()",
                                "mutex unlock");

        if (code && code != ETIMEDOUT)
            qt_report_pthread_error(code, "QWaitCondition::wait()", "cv wait");

        return (code == 0);
    }